

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

bool __thiscall icu_63::SpoofImpl::isIllegalCombiningDotLeadCharacter(SpoofImpl *this,UChar32 cp)

{
  bool bVar1;
  int32_t iVar2;
  UChar32 cp_00;
  UChar32 finalCp;
  undefined1 local_60 [8];
  UnicodeString skelStr;
  UChar32 cp_local;
  SpoofImpl *this_local;
  
  skelStr.fUnion._52_4_ = cp;
  bVar1 = isIllegalCombiningDotLeadCharacterNoLookup(cp);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    UnicodeString::UnicodeString((UnicodeString *)local_60);
    SpoofData::confusableLookup(this->fSpoofData,skelStr.fUnion._52_4_,(UnicodeString *)local_60);
    iVar2 = UnicodeString::length((UnicodeString *)local_60);
    iVar2 = UnicodeString::moveIndex32((UnicodeString *)local_60,iVar2,-1);
    cp_00 = UnicodeString::char32At((UnicodeString *)local_60,iVar2);
    if ((cp_00 == skelStr.fUnion._52_4_) ||
       (bVar1 = isIllegalCombiningDotLeadCharacterNoLookup(cp_00), !bVar1)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_60);
  }
  return this_local._7_1_;
}

Assistant:

bool SpoofImpl::isIllegalCombiningDotLeadCharacter(UChar32 cp) const {
    if (isIllegalCombiningDotLeadCharacterNoLookup(cp)) {
        return true;
    }
    UnicodeString skelStr;
    fSpoofData->confusableLookup(cp, skelStr);
    UChar32 finalCp = skelStr.char32At(skelStr.moveIndex32(skelStr.length(), -1));
    if (finalCp != cp && isIllegalCombiningDotLeadCharacterNoLookup(finalCp)) {
        return true;
    }
    return false;
}